

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::decomposeGeometryMethods
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped **node,TIntermNode *arguments)

{
  pointer *pptVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TPoolAllocator *pTVar5;
  TIntermAggregate *pTVar6;
  long lVar7;
  TIntermNode *right;
  TIntermAggregate *left;
  undefined1 local_c8 [16];
  char *pcStack_b8;
  undefined8 uStack_b0;
  long *plVar4;
  
  if (*node == (TIntermTyped *)0x0) {
    return;
  }
  iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return;
  }
  iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0xb8);
  if (arguments == (TIntermNode *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    iVar3 = (*arguments->_vptr_TIntermNode[6])(arguments);
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
  }
  if (iVar2 == 0x2d6) {
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
      pTVar5 = GetThreadPoolAllocator();
      pTVar6 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar5,0x188);
      TIntermAggregate::TIntermAggregate(pTVar6,EOpEndPrimitive);
      (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                (pTVar6);
      TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar6,(TType *)local_c8);
      goto LAB_00416b07;
    }
  }
  else {
    if (iVar2 != 0x2d5) {
      return;
    }
    if (plVar4 == (long *)0x0) {
      return;
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
      pTVar5 = GetThreadPoolAllocator();
      pTVar6 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar5,0x188);
      TIntermAggregate::TIntermAggregate(pTVar6,EOpEmitVertex);
      (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                (pTVar6);
      TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar6);
      lVar7 = (**(code **)(*plVar4 + 0x198))(plVar4);
      right = (TIntermNode *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 8) + 0x18))();
      left = TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TIntermNode *)0x0,right,loc);
      pTVar6 = TIntermediate::growAggregate
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (TIntermNode *)left,(TIntermNode *)pTVar6);
      (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31]
      )(pTVar6,1);
      (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                (pTVar6);
      TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar6,(TType *)local_c8);
      uStack_b0._0_4_ = loc->column;
      uStack_b0._4_4_ = *(undefined4 *)&loc->field_0x14;
      local_c8._8_8_ = loc->name;
      pcStack_b8 = *(char **)&loc->string;
      __position._M_current =
           (this->gsAppends).
           super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
           .
           super__Vector_base<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->gsAppends).
          super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
          .
          super__Vector_base<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_c8._0_8_ = pTVar6;
        std::
        vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
        ::_M_realloc_insert<glslang::HlslParseContext::tGsAppendData>
                  (&(this->gsAppends).
                    super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                   ,__position,(tGsAppendData *)local_c8);
      }
      else {
        *(char **)&((__position._M_current)->loc).string = pcStack_b8;
        ((__position._M_current)->loc).column = (undefined4)uStack_b0;
        *(undefined4 *)&((__position._M_current)->loc).field_0x14 = uStack_b0._4_4_;
        (__position._M_current)->node = pTVar6;
        ((__position._M_current)->loc).name = (TString *)local_c8._8_8_;
        pptVar1 = &(this->gsAppends).
                   super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                   .
                   super__Vector_base<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      goto LAB_00416b07;
    }
  }
  pTVar6 = (TIntermAggregate *)0x0;
LAB_00416b07:
  *node = (TIntermTyped *)pTVar6;
  return;
}

Assistant:

void HlslParseContext::decomposeGeometryMethods(const TSourceLoc& loc, TIntermTyped*& node, TIntermNode* arguments)
{
    if (node == nullptr || !node->getAsOperator())
        return;

    const TOperator op  = node->getAsOperator()->getOp();
    const TIntermAggregate* argAggregate = arguments ? arguments->getAsAggregate() : nullptr;

    switch (op) {
    case EOpMethodAppend:
        if (argAggregate) {
            // Don't emit these for non-GS stage, since we won't have the gsStreamOutput symbol.
            if (language != EShLangGeometry) {
                node = nullptr;
                return;
            }

            TIntermAggregate* sequence = nullptr;
            TIntermAggregate* emit = new TIntermAggregate(EOpEmitVertex);

            emit->setLoc(loc);
            emit->setType(TType(EbtVoid));

            TIntermTyped* data = argAggregate->getSequence()[1]->getAsTyped();

            // This will be patched in finalization during finalizeAppendMethods()
            sequence = intermediate.growAggregate(sequence, data, loc);
            sequence = intermediate.growAggregate(sequence, emit);

            sequence->setOperator(EOpSequence);
            sequence->setLoc(loc);
            sequence->setType(TType(EbtVoid));

            gsAppends.push_back({sequence, loc});

            node = sequence;
        }
        break;

    case EOpMethodRestartStrip:
        {
            // Don't emit these for non-GS stage, since we won't have the gsStreamOutput symbol.
            if (language != EShLangGeometry) {
                node = nullptr;
                return;
            }

            TIntermAggregate* cut = new TIntermAggregate(EOpEndPrimitive);
            cut->setLoc(loc);
            cut->setType(TType(EbtVoid));
            node = cut;
        }
        break;

    default:
        break; // most pass through unchanged
    }
}